

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O2

int __thiscall
QFragmentMapData<QTextBlockData>::length(QFragmentMapData<QTextBlockData> *this,uint field)

{
  int iVar1;
  int iVar2;
  Header *pHVar3;
  uint uVar4;
  ulong uVar5;
  
  pHVar3 = (this->field_0).head;
  uVar5 = (ulong)pHVar3->root;
  if (uVar5 != 0) {
    iVar1 = *(int *)((long)pHVar3 + ((ulong)field + 7) * 4 + uVar5 * 0x48);
    iVar2 = *(int *)((long)pHVar3 + ((ulong)field + 4) * 4 + uVar5 * 0x48);
    uVar4 = sizeRight(this,pHVar3->root,field);
    return uVar4 + iVar1 + iVar2;
  }
  return 0;
}

Assistant:

int QFragmentMapData<Fragment>::length(uint field) const {
    uint root = this->root();
    return root ? sizeLeft(root, field) + size(root, field) + sizeRight(root, field) : 0;
}